

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O1

void __thiscall absl::base_internal::SpinLock::SlowLock(SpinLock *this)

{
  uint32_t uVar1;
  uint32_t value;
  uint uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  SchedulingMode SVar8;
  bool bVar9;
  
  value = SpinLoop(this);
  if ((value & 1) == 0) {
    LOCK();
    uVar1 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    if (value == uVar1) {
      (this->lockword_).super___atomic_base<unsigned_int>._M_i = value | 1;
      uVar1 = value;
    }
    value = uVar1;
    UNLOCK();
  }
  if ((value & 1) != 0) {
    SVar8 = value >> 1;
    if (CycleClock::cycle_clock_source_ == (code *)0x0) {
      lVar3 = rdtsc();
    }
    else {
      lVar3 = (*CycleClock::cycle_clock_source_)();
    }
    iVar7 = 0;
    uVar6 = 0;
    do {
      if (value < 8) {
        LOCK();
        uVar2 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
        bVar9 = value == uVar2;
        if (bVar9) {
          (this->lockword_).super___atomic_base<unsigned_int>._M_i = value | 8;
          uVar2 = value;
        }
        value = uVar2;
        UNLOCK();
        if (bVar9) {
          value = value | 8;
          goto LAB_00114ac6;
        }
        if ((value & 1) == 0) goto LAB_00114aa2;
        if (7 < value) goto LAB_00114ac6;
      }
      else {
LAB_00114ac6:
        iVar7 = iVar7 + 1;
        AbslInternalSpinLockDelay
                  (&this->lockword_,value,iVar7,SVar8 & SCHEDULE_COOPERATIVE_AND_KERNEL);
        value = SpinLoop(this);
        if (CycleClock::cycle_clock_source_ == (code *)0x0) {
          lVar4 = rdtsc();
        }
        else {
          lVar4 = (*CycleClock::cycle_clock_source_)();
        }
        uVar5 = (lVar4 >> 2) - (lVar3 >> 2) >> 7;
        if (0x1ffffffe < (long)uVar5) {
          uVar5 = 0x1fffffff;
        }
        uVar2 = (int)uVar5 << 3;
        uVar6 = 8;
        if (((uVar5 & 0x1fffffff) != 0) && (uVar6 = uVar2, uVar2 == 8)) {
          uVar6 = 0x10;
        }
        if ((value & 1) == 0) {
LAB_00114aa2:
          LOCK();
          uVar2 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
          if (value == uVar2) {
            (this->lockword_).super___atomic_base<unsigned_int>._M_i = value | uVar6 | 1;
            uVar2 = value;
          }
          value = uVar2;
          UNLOCK();
        }
      }
    } while ((value & 1) != 0);
  }
  return;
}

Assistant:

void SpinLock::SlowLock() {
  uint32_t lock_value = SpinLoop();
  lock_value = TryLockInternal(lock_value, 0);
  if ((lock_value & kSpinLockHeld) == 0) {
    return;
  }

  base_internal::SchedulingMode scheduling_mode;
  if ((lock_value & kSpinLockCooperative) != 0) {
    scheduling_mode = base_internal::SCHEDULE_COOPERATIVE_AND_KERNEL;
  } else {
    scheduling_mode = base_internal::SCHEDULE_KERNEL_ONLY;
  }

  // The lock was not obtained initially, so this thread needs to wait for
  // it.  Record the current timestamp in the local variable wait_start_time
  // so the total wait time can be stored in the lockword once this thread
  // obtains the lock.
  int64_t wait_start_time = CycleClock::Now();
  uint32_t wait_cycles = 0;
  int lock_wait_call_count = 0;
  while ((lock_value & kSpinLockHeld) != 0) {
    // If the lock is currently held, but not marked as having a sleeper, mark
    // it as having a sleeper.
    if ((lock_value & kWaitTimeMask) == 0) {
      // Here, just "mark" that the thread is going to sleep.  Don't store the
      // lock wait time in the lock -- the lock word stores the amount of time
      // that the current holder waited before acquiring the lock, not the wait
      // time of any thread currently waiting to acquire it.
      if (lockword_.compare_exchange_strong(
              lock_value, lock_value | kSpinLockSleeper,
              std::memory_order_relaxed, std::memory_order_relaxed)) {
        // Successfully transitioned to kSpinLockSleeper.  Pass
        // kSpinLockSleeper to the SpinLockWait routine to properly indicate
        // the last lock_value observed.
        lock_value |= kSpinLockSleeper;
      } else if ((lock_value & kSpinLockHeld) == 0) {
        // Lock is free again, so try and acquire it before sleeping.  The
        // new lock state will be the number of cycles this thread waited if
        // this thread obtains the lock.
        lock_value = TryLockInternal(lock_value, wait_cycles);
        continue;   // Skip the delay at the end of the loop.
      } else if ((lock_value & kWaitTimeMask) == 0) {
        // The lock is still held, without a waiter being marked, but something
        // else about the lock word changed, causing our CAS to fail. For
        // example, a new lock holder may have acquired the lock with
        // kSpinLockDisabledScheduling set, whereas the previous holder had not
        // set that flag. In this case, attempt again to mark ourselves as a
        // waiter.
        continue;
      }
    }

    // SpinLockDelay() calls into fiber scheduler, we need to see
    // synchronization there to avoid false positives.
    ABSL_TSAN_MUTEX_PRE_DIVERT(this, 0);
    // Wait for an OS specific delay.
    base_internal::SpinLockDelay(&lockword_, lock_value, ++lock_wait_call_count,
                                 scheduling_mode);
    ABSL_TSAN_MUTEX_POST_DIVERT(this, 0);
    // Spin again after returning from the wait routine to give this thread
    // some chance of obtaining the lock.
    lock_value = SpinLoop();
    wait_cycles = EncodeWaitCycles(wait_start_time, CycleClock::Now());
    lock_value = TryLockInternal(lock_value, wait_cycles);
  }
}